

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::BatchSubmitResponse::printTo(BatchSubmitResponse *this,ostream *out)

{
  ostream *poVar1;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  BatchSubmitResponse *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"BatchSubmitResponse(");
  poVar1 = std::operator<<(local_18,"ok=");
  apache::thrift::to_string<bool>(&local_38,&this->ok);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<(local_18,")");
  return;
}

Assistant:

void BatchSubmitResponse::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BatchSubmitResponse(";
  out << "ok=" << to_string(ok);
  out << ")";
}